

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parseInlineQueryResultCachedGif_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  element_type *peVar1;
  string *this_00;
  string local_40;
  
  peVar1 = (object->
           super___shared_ptr<TgBot::InlineQueryResultCachedGif,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    this_00 = &local_40;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"gif_file_id","");
    appendToJson((TgTypeParser *)this_00,__return_storage_ptr__,&local_40,
                 &((object->
                   super___shared_ptr<TgBot::InlineQueryResultCachedGif,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->gifFileId);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseInlineQueryResultCachedGif(const InlineQueryResultCachedGif::Ptr& object) const {
    if (!object){
        return "";
    }
    // This function will be called by parseInlineQueryResult(), so I don't add
    // curly brackets to the result string.
    string result;
    appendToJson(result, "gif_file_id", object->gifFileId);
    // The last comma will be erased by parseInlineQueryResult().
    return result;
}